

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON__UINT32 Internal_DoubleArrayDataCRC(ON__UINT32 current_remainder,size_t count,double *a)

{
  double *pdVar1;
  double dVar2;
  undefined1 uVar3;
  endian eVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  double dVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  double x;
  undefined8 local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  eVar4 = ON::Endian();
  dVar2 = ON_DBL_QNAN;
  if ((a != (double *)0x0) && (0 < (long)count)) {
    pdVar1 = a + count;
    local_38 = ON_DBL_QNAN;
    local_40 = (ulong)ON_DBL_QNAN >> 0x38;
    local_5c = (uint)((ulong)ON_DBL_QNAN >> 8) & 0xffffff;
    local_48 = (ulong)ON_DBL_QNAN >> 0x30;
    local_60 = (uint)((ulong)ON_DBL_QNAN >> 0x10) & 0xffff;
    local_50 = (ulong)ON_DBL_QNAN >> 0x28;
    local_64 = (uint)((ulong)ON_DBL_QNAN >> 0x18) & 0xff;
    local_58 = (ulong)ON_DBL_QNAN >> 0x20;
    do {
      dVar8 = *a;
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        if (NAN(dVar8)) {
          local_70 = local_38;
          uVar3 = (undefined1)local_58;
          uVar5 = (undefined1)local_64;
          uVar6 = (undefined1)local_50;
          uVar7 = (undefined1)local_60;
          uVar9 = (undefined1)local_48;
          uVar10 = (undefined1)local_5c;
          uVar11 = (undefined1)local_40;
          dVar8 = (double)((ulong)dVar2 & 0xffffffff);
        }
        else {
          uVar3 = (undefined1)((ulong)dVar8 >> 0x20);
          uVar5 = (undefined1)((ulong)dVar8 >> 0x18);
          uVar6 = (undefined1)((ulong)dVar8 >> 0x28);
          uVar7 = (undefined1)((ulong)dVar8 >> 0x10);
          uVar9 = (undefined1)((ulong)dVar8 >> 0x30);
          uVar10 = (undefined1)((ulong)dVar8 >> 8);
          uVar11 = (undefined1)((ulong)dVar8 >> 0x38);
          local_70 = dVar8;
        }
      }
      else {
        local_70 = 0.0;
        uVar3 = 0;
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
        uVar9 = 0;
        uVar10 = 0;
        uVar11 = 0;
        dVar8 = 0.0;
      }
      if (eVar4 == big_endian) {
        local_70 = (double)CONCAT35(CONCAT21(CONCAT11(SUB81(dVar8,0),uVar10),uVar7),
                                    CONCAT14(uVar5,CONCAT13(uVar3,CONCAT12(uVar6,CONCAT11(uVar9,
                                                  uVar11)))));
      }
      a = a + 1;
      current_remainder = ON_CRC32(current_remainder,8,&local_70);
    } while (a < pdVar1);
  }
  return current_remainder;
}

Assistant:

static ON__UINT32 Internal_DoubleArrayDataCRC(
  ON__UINT32 current_remainder,
  size_t count,
  const double* a
)
{
  double x;
  char* byte_swap 
    = (ON::endian::big_endian == ON::Endian()) 
    ? ((char*)&x)
    : nullptr;
  char c;
  if (nullptr != a && count > 0)
  {
    const double* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      if (0.0 == x)
        x = 0.0; // change -0.0 into +0.0
      else if (false == (x == x))
        x = ON_DBL_QNAN; // change any nan into ON_DBL_QNAN.
      if (nullptr != byte_swap)
      {
        c = byte_swap[0]; byte_swap[0] = byte_swap[7]; byte_swap[7] = c;
        c = byte_swap[1]; byte_swap[1] = byte_swap[6]; byte_swap[6] = c;
        c = byte_swap[2]; byte_swap[2] = byte_swap[5]; byte_swap[5] = c;
        c = byte_swap[3]; byte_swap[3] = byte_swap[4]; byte_swap[4] = c;
      }
      current_remainder = ON_CRC32(current_remainder, sizeof(x), (const void*)&x);
    }
  }
  return current_remainder;
}